

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O0

void Assimp::ArmaturePopulate::BuildBoneStack
               (aiNode *current_node,aiNode *root_node,aiScene *scene,
               vector<aiBone_*,_std::allocator<aiBone_*>_> *bones,
               map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
               *bone_stack,vector<aiNode_*,_std::allocator<aiNode_*>_> *node_stack)

{
  bool bVar1;
  reference ppaVar2;
  Logger *pLVar3;
  basic_formatter *pbVar4;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar5;
  pair<aiBone_*,_aiNode_*> local_3c8;
  char *local_3b8;
  char *local_3b0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_230;
  char *local_200;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_80;
  aiNode *local_60;
  aiNode *node;
  aiBone *bone;
  const_iterator __end1;
  const_iterator __begin1;
  vector<aiBone_*,_std::allocator<aiBone_*>_> *__range1;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *node_stack_local;
  map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
  *bone_stack_local;
  vector<aiBone_*,_std::allocator<aiBone_*>_> *bones_local;
  aiScene *scene_local;
  aiNode *root_node_local;
  aiNode *current_node_local;
  
  if (scene == (aiScene *)0x0) {
    __assert_fail("scene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                  ,0xa9,
                  "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  if (root_node == (aiNode *)0x0) {
    __assert_fail("root_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                  ,0xaa,
                  "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  bVar1 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::empty(node_stack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!node_stack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                  ,0xab,
                  "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  __end1 = std::vector<aiBone_*,_std::allocator<aiBone_*>_>::begin(bones);
  bone = (aiBone *)std::vector<aiBone_*,_std::allocator<aiBone_*>_>::end(bones);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<aiBone_*const_*,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>
                                *)&bone);
    if (!bVar1) {
      return;
    }
    ppaVar2 = __gnu_cxx::
              __normal_iterator<aiBone_*const_*,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>
              ::operator*(&__end1);
    node = (aiNode *)*ppaVar2;
    if (node == (aiNode *)0x0) {
      __assert_fail("bone",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                    ,0xae,
                    "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                   );
    }
    local_60 = GetNodeFromStack((aiString *)node,node_stack);
    if (local_60 == (aiNode *)0x0) {
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::clear(node_stack);
      BuildNodeList(root_node,node_stack);
      pLVar3 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[39]>(&local_1f8,(char (*) [39])"Resetting bone stack: nullptr element ");
      local_200 = aiString::C_Str(&node->mName);
      pbVar4 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_1f8,&local_200);
      Formatter::basic_formatter::operator_cast_to_string(&local_80,pbVar4);
      Logger::debug(pLVar3,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1f8);
      local_60 = GetNodeFromStack(&node->mName,node_stack);
      if (local_60 != (aiNode *)0x0) goto LAB_005d82fe;
      pLVar3 = DefaultLogger::get();
      Logger::error(pLVar3,"serious import issue node for bone was not detected");
    }
    else {
LAB_005d82fe:
      pLVar3 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[25]>(&local_3a8,(char (*) [25])"Successfully added bone[");
      local_3b0 = aiString::C_Str(&node->mName);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_3a8,&local_3b0);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar5,(char (*) [30])"] to stack and bone node is: ");
      local_3b8 = aiString::C_Str(&local_60->mName);
      pbVar4 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar5,&local_3b8);
      Formatter::basic_formatter::operator_cast_to_string(&local_230,pbVar4);
      Logger::debug(pLVar3,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_3a8);
      std::pair<aiBone_*,_aiNode_*>::pair<aiBone_*&,_aiNode_*&,_true>
                (&local_3c8,(aiBone **)&node,&local_60);
      std::map<aiBone*,aiNode*,std::less<aiBone*>,std::allocator<std::pair<aiBone*const,aiNode*>>>::
      insert<std::pair<aiBone*,aiNode*>>
                ((map<aiBone*,aiNode*,std::less<aiBone*>,std::allocator<std::pair<aiBone*const,aiNode*>>>
                  *)bone_stack,&local_3c8);
    }
    __gnu_cxx::__normal_iterator<aiBone_*const_*,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void ArmaturePopulate::BuildBoneStack(aiNode *current_node,
                                      const aiNode *root_node,
                                      const aiScene *scene,
                                      const std::vector<aiBone *> &bones,
                                      std::map<aiBone *, aiNode *> &bone_stack,
                                      std::vector<aiNode *> &node_stack) {
  ai_assert(scene);
  ai_assert(root_node);
  ai_assert(!node_stack.empty());

  for (aiBone *bone : bones) {
    ai_assert(bone);
    aiNode *node = GetNodeFromStack(bone->mName, node_stack);
    if (node == nullptr) {
      node_stack.clear();
      BuildNodeList(root_node, node_stack);
      ASSIMP_LOG_DEBUG_F("Resetting bone stack: nullptr element ", bone->mName.C_Str());

      node = GetNodeFromStack(bone->mName, node_stack);

      if (!node) {
        ASSIMP_LOG_ERROR("serious import issue node for bone was not detected");
        continue;
      }
    }

    ASSIMP_LOG_DEBUG_F("Successfully added bone[", bone->mName.C_Str(), "] to stack and bone node is: ", node->mName.C_Str());

    bone_stack.insert(std::pair<aiBone *, aiNode *>(bone, node));
  }
}